

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int XMLNode_move_child(XMLNode *node,int from,int to)

{
  int iVar1;
  _XMLNode *p_Var2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  iVar3 = 0;
  if ((((node != (XMLNode *)0x0) && (-1 < from)) && (node->init_value == 0x19770522)) &&
     (iVar1 = node->n_children, from < iVar1)) {
    iVar3 = 0;
    if (0 < to) {
      iVar3 = to;
    }
    iVar5 = iVar1 + -1;
    if (iVar3 < iVar1) {
      iVar5 = iVar3;
    }
    uVar4 = (ulong)(uint)from;
    p_Var2 = node->children[uVar4];
    if (from < iVar5) {
      do {
        node->children[uVar4] = node->children[uVar4 + 1];
        from = from + 1;
        uVar4 = uVar4 + 1;
      } while (from < iVar5);
    }
    else if (iVar5 < from) {
      do {
        node->children[uVar4] = node->children[uVar4 - 1];
        uVar4 = uVar4 - 1;
      } while ((long)iVar5 < (long)uVar4);
    }
    node->children[iVar5] = p_Var2;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int XMLNode_move_child(XMLNode* node, int from, int to)
{
	XMLNode* nfrom;

	CHECK_NODE(node, FALSE);
	if (from < 0 || from >= node->n_children)
		return FALSE;
	if (to < 0) /* Before first => first */
		to = 0;
	if (to >= node->n_children) /* After last => last */
		to = node->n_children - 1;

	nfrom = node->children[from];
	if (to > from) { /* Move forward: bring following nodes (up to 'to') backward one position */
		int i;
		for (i = from; i < to; i++)
			node->children[i] = node->children[i+1];
	} else { /* Move backward: bring previous nodes (up to 'from') forward one position */
		int i;
		for (i = from - 1; i >= to; i--)
			node->children[i+1] = node->children[i];
	}
	node->children[to] = nfrom;

	return TRUE;
}